

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetReturnNewest(void *kinmem,int ret_newest)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,0x126,"KINSetReturnNewest",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
  }
  else {
    *(int *)((long)kinmem + 0x160) = ret_newest;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetReturnNewest(void* kinmem, sunbooleantype ret_newest)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  kin_mem->kin_ret_newest = ret_newest;

  return (KIN_SUCCESS);
}